

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O1

boolean jpeg_fill_bit_buffer
                  (bitread_working_state *state,bit_buf_type get_buffer,int bits_left,int nbits)

{
  byte bVar1;
  j_decompress_ptr pjVar2;
  jpeg_error_mgr *pjVar3;
  boolean bVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  byte *pbVar8;
  
  pbVar8 = state->next_input_byte;
  sVar7 = state->bytes_in_buffer;
  pjVar2 = state->cinfo;
  if (pjVar2->unread_marker == 0) {
    do {
      if (0x38 < bits_left) goto LAB_0011b7ad;
      if (sVar7 == 0) {
        bVar4 = (*pjVar2->src->fill_input_buffer)(pjVar2);
        if (bVar4 != 0) {
          pbVar8 = pjVar2->src->next_input_byte;
          sVar7 = pjVar2->src->bytes_in_buffer;
          goto LAB_0011b7f6;
        }
LAB_0011b850:
        iVar5 = 1;
        sVar7 = 0;
      }
      else {
LAB_0011b7f6:
        sVar7 = sVar7 - 1;
        uVar6 = (ulong)*pbVar8;
        pbVar8 = pbVar8 + 1;
        if (uVar6 == 0xff) {
          do {
            if (sVar7 == 0) {
              bVar4 = (*pjVar2->src->fill_input_buffer)(pjVar2);
              if (bVar4 == 0) goto LAB_0011b850;
              pbVar8 = pjVar2->src->next_input_byte;
              sVar7 = pjVar2->src->bytes_in_buffer;
            }
            sVar7 = sVar7 - 1;
            bVar1 = *pbVar8;
            pbVar8 = pbVar8 + 1;
          } while (bVar1 == 0xff);
          if (bVar1 != 0) {
            pjVar2->unread_marker = (uint)bVar1;
            iVar5 = 6;
            goto LAB_0011b866;
          }
          uVar6 = 0xff;
        }
        get_buffer = get_buffer << 8 | uVar6;
        bits_left = bits_left + 8;
        iVar5 = 0;
      }
LAB_0011b866:
    } while (iVar5 == 0);
    if (iVar5 != 6) {
      return 0;
    }
  }
  if (bits_left < nbits) {
    if (pjVar2->entropy->insufficient_data == 0) {
      pjVar3 = pjVar2->err;
      pjVar3->msg_code = 0x75;
      (*pjVar3->emit_message)((j_common_ptr)pjVar2,-1);
      pjVar2->entropy->insufficient_data = 1;
    }
    get_buffer = get_buffer << (0x39U - (char)bits_left & 0x3f);
    bits_left = 0x39;
  }
LAB_0011b7ad:
  state->next_input_byte = pbVar8;
  state->bytes_in_buffer = sVar7;
  state->get_buffer = get_buffer;
  state->bits_left = bits_left;
  return 1;
}

Assistant:

GLOBAL(boolean)
jpeg_fill_bit_buffer(bitread_working_state *state,
                     register bit_buf_type get_buffer, register int bits_left,
                     int nbits)
/* Load up the bit buffer to a depth of at least nbits */
{
  /* Copy heavily used state fields into locals (hopefully registers) */
  register const JOCTET *next_input_byte = state->next_input_byte;
  register size_t bytes_in_buffer = state->bytes_in_buffer;
  j_decompress_ptr cinfo = state->cinfo;

  /* Attempt to load at least MIN_GET_BITS bits into get_buffer. */
  /* (It is assumed that no request will be for more than that many bits.) */
  /* We fail to do so only if we hit a marker or are forced to suspend. */

  if (cinfo->unread_marker == 0) {      /* cannot advance past a marker */
    while (bits_left < MIN_GET_BITS) {
      register int c;

      /* Attempt to read a byte */
      if (bytes_in_buffer == 0) {
        if (!(*cinfo->src->fill_input_buffer) (cinfo))
          return FALSE;
        next_input_byte = cinfo->src->next_input_byte;
        bytes_in_buffer = cinfo->src->bytes_in_buffer;
      }
      bytes_in_buffer--;
      c = *next_input_byte++;

      /* If it's 0xFF, check and discard stuffed zero byte */
      if (c == 0xFF) {
        /* Loop here to discard any padding FF's on terminating marker,
         * so that we can save a valid unread_marker value.  NOTE: we will
         * accept multiple FF's followed by a 0 as meaning a single FF data
         * byte.  This data pattern is not valid according to the standard.
         */
        do {
          if (bytes_in_buffer == 0) {
            if (!(*cinfo->src->fill_input_buffer) (cinfo))
              return FALSE;
            next_input_byte = cinfo->src->next_input_byte;
            bytes_in_buffer = cinfo->src->bytes_in_buffer;
          }
          bytes_in_buffer--;
          c = *next_input_byte++;
        } while (c == 0xFF);

        if (c == 0) {
          /* Found FF/00, which represents an FF data byte */
          c = 0xFF;
        } else {
          /* Oops, it's actually a marker indicating end of compressed data.
           * Save the marker code for later use.
           * Fine point: it might appear that we should save the marker into
           * bitread working state, not straight into permanent state.  But
           * once we have hit a marker, we cannot need to suspend within the
           * current MCU, because we will read no more bytes from the data
           * source.  So it is OK to update permanent state right away.
           */
          cinfo->unread_marker = c;
          /* See if we need to insert some fake zero bits. */
          goto no_more_bytes;
        }
      }

      /* OK, load c into get_buffer */
      get_buffer = (get_buffer << 8) | c;
      bits_left += 8;
    } /* end while */
  } else {
no_more_bytes:
    /* We get here if we've read the marker that terminates the compressed
     * data segment.  There should be enough bits in the buffer register
     * to satisfy the request; if so, no problem.
     */
    if (nbits > bits_left) {
      /* Uh-oh.  Report corrupted data to user and stuff zeroes into
       * the data stream, so that we can produce some kind of image.
       * We use a nonvolatile flag to ensure that only one warning message
       * appears per data segment.
       */
      if (!cinfo->entropy->insufficient_data) {
        WARNMS(cinfo, JWRN_HIT_MARKER);
        cinfo->entropy->insufficient_data = TRUE;
      }
      /* Fill the buffer with zero bits */
      get_buffer <<= MIN_GET_BITS - bits_left;
      bits_left = MIN_GET_BITS;
    }
  }

  /* Unload the local registers */
  state->next_input_byte = next_input_byte;
  state->bytes_in_buffer = bytes_in_buffer;
  state->get_buffer = get_buffer;
  state->bits_left = bits_left;

  return TRUE;
}